

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-precede.cpp
# Opt level: O2

Clause * __thiscall value_precede::ex_t(value_precede *this,int ti)

{
  IntVar *pIVar1;
  int iVar2;
  Clause *this_00;
  Lit *pLVar3;
  ulong uVar4;
  ulong uVar5;
  
  this_00 = Reason_new(ti + 1);
  uVar5 = 0;
  uVar4 = (ulong)(uint)ti;
  if (ti < 1) {
    uVar4 = uVar5;
  }
  while (uVar4 != uVar5) {
    pIVar1 = (this->xs).data[uVar5];
    uVar5 = uVar5 + 1;
    iVar2 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xd])
                      (pIVar1,(long)*(int *)&(this->super_Propagator).field_0x14,1);
    pLVar3 = Clause::operator[](this_00,(int)uVar5);
    pLVar3->x = iVar2;
  }
  return this_00;
}

Assistant:

Clause* ex_t(int ti) {
		Clause* r(Reason_new(ti + 1));
		int jj = 1;
		for (int ii = 0; ii < ti; ++ii, ++jj) {
			assert(!xs[ii]->indomain(s));
			(*r)[jj] = xs[ii]->getLit(s, LR_EQ);
		}
		return r;
	}